

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void subflow_starvation(size_t W)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  element_type *peVar3;
  _Head_base<0UL,_std::__future_base::_Result_base_*,_false> _Var4;
  Executor *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  size_t W_local;
  atomic<unsigned_long> barrier;
  atomic<unsigned_long> counter;
  size_t B;
  size_t L;
  Future<void> local_2c8;
  shared_ptr<tf::WorkerInterface> local_2a8;
  mutex mutex;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  Executor executor;
  Taskflow taskflow;
  
  L = 100;
  set._M_h._M_buckets = (__buckets_ptr)&B;
  B = 0x400;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  executor._notifier._7_2_ = 0x17;
  executor._notifier._waiters.
  super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x17;
  executor._taskflows_mutex.super___mutex_base._M_mutex.__align =
       *(long *)(doctest::detail::g_cs + 0x20);
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__owner = 0xc;
  executor._taskflows_mutex.super___mutex_base._M_mutex._16_8_ = anon_var_dwarf_4f812;
  executor._taskflows_mutex.super___mutex_base._M_mutex._24_4_ = 0x130;
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)anon_var_dwarf_4fa3e;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 1;
  executor._topology_cv = (condition_variable)0x0;
  executor._104_8_ = (long)"TracerPid:\t" + 0xb;
  executor._112_8_ = (long)"TracerPid:\t" + 0xb;
  set._M_h._M_bucket_count = CONCAT44(set._M_h._M_bucket_count._4_4_,0xc);
  W_local = W;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator><unsigned_long,_nullptr>
            ((Result *)&taskflow,(Expression_lhs<const_unsigned_long_&> *)&set,&W_local);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&executor,(Result *)&taskflow);
  doctest::String::~String((String *)&taskflow._mutex);
  dVar2 = doctest::detail::ResultBuilder::log
                    ((ResultBuilder *)&executor,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))
  ;
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&executor);
  doctest::AssertData::~AssertData((AssertData *)&executor);
  tf::Taskflow::Taskflow(&taskflow);
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W_local,&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  barrier.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  peVar3 = (element_type *)operator_new(0xd8);
  peVar3->_vptr__State_baseV2 = (_func_int **)0x0;
  (peVar3->_M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)&peVar3->_M_once;
  peVar3->_M_status = (atomic<unsigned_int>)0x0;
  peVar3->_M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar3->field_0x15 = 0;
  *(undefined1 *)&(peVar3->_M_once)._M_once = 0;
  peVar3[1]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar3[1]._M_status = (atomic<unsigned_int>)0x0;
  peVar3[1]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar3[1].field_0x15 = 0;
  *(undefined8 *)&peVar3[1]._M_once = 0;
  peVar3[2]._vptr__State_baseV2 = (_func_int **)0x0;
  peVar3[2]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)(peVar3 + 3);
  *(_Result_base **)&peVar3[2]._M_status = (_Result_base *)(peVar3 + 3);
  *(element_type **)&peVar3[2]._M_once = peVar3 + 4;
  peVar3[4]._vptr__State_baseV2 = (_func_int **)0x0;
  peVar3[4]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar3[4]._M_status = (atomic<unsigned_int>)0x0;
  peVar3[4]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar3[4].field_0x15 = 0;
  *(undefined8 *)&peVar3[4]._M_once = 0;
  peVar3[5]._vptr__State_baseV2 = (_func_int **)0x0;
  _Var4._M_head_impl = (_Result_base *)operator_new(0x40);
  *(atomic<unsigned_long> **)_Var4._M_head_impl = &barrier;
  *(size_t **)(_Var4._M_head_impl + 8) = &B;
  *(atomic<unsigned_long> **)(_Var4._M_head_impl + 0x10) = &counter;
  *(size_t **)(_Var4._M_head_impl + 0x18) = &L;
  *(unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> **)
   (_Var4._M_head_impl + 0x20) = &set;
  *(size_t **)(_Var4._M_head_impl + 0x28) = &W_local;
  *(mutex **)(_Var4._M_head_impl + 0x30) = &mutex;
  *(Executor **)(_Var4._M_head_impl + 0x38) = &executor;
  peVar3[4]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       _Var4._M_head_impl;
  peVar3[5]._vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:316:20)>
       ::_M_invoke;
  *(code **)&peVar3[4]._M_once =
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:316:20)>
       ::_M_manager;
  peVar3[5]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar3[5]._M_status = (atomic<unsigned_int>)0x0;
  peVar3[5]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar3[5].field_0x15 = 0;
  *(undefined8 *)&peVar3[5]._M_once = 0;
  *(undefined1 *)&peVar3[6]._vptr__State_baseV2 = 3;
  peVar3[6]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar3[6]._M_status = (atomic<unsigned_int>)0x0;
  peVar3[6]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar3[6].field_0x15 = 0;
  local_2c8.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)taskflow.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2c8);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2c8);
  this = &executor;
  tf::Executor::run_n(&local_2c8,this,&taskflow,5);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_2c8,this);
  tf::Future<void>::~Future(&local_2c8);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void subflow_starvation(size_t W) {

  size_t L=100, B = 1024;

  REQUIRE(B > W);
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter{0};
  std::atomic<size_t> barrier{0};

  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  taskflow.emplace([&](tf::Subflow& subflow){

    auto [merge, cond, stop] = subflow.emplace(
      [&](){  
        REQUIRE(barrier.load(std::memory_order_relaxed) == B);
        REQUIRE(counter.load(std::memory_order_relaxed) == (L + B - 1));
        REQUIRE(set.size() == W);
        counter = 0;
        barrier = 0;
        set.clear();
      },
      [n=0]() mutable { 
        return ++n >= 5 ? 1 : 0;
      },
      [&](){
        REQUIRE(barrier.load(std::memory_order_relaxed) == 0);
        REQUIRE(counter.load(std::memory_order_relaxed) == 0);
        REQUIRE(set.size() == 0);
      }
    );

    tf::Task prev, curr, second;
    
    // linear chain with delay to make workers sleep
    for(size_t l=0; l<L; l++) {

      curr = subflow.emplace([&, l](){
        if(l) {
          counter.fetch_add(1, std::memory_order_relaxed);
        }
      });

      if(l) {
        curr.succeed(prev);
      }

      if(l==1) {
        second = curr;
      }

      prev = curr;
    }
    
    cond.precede(second, stop);


    // fork
    for(size_t b=0; b<B; b++) {
      tf::Task task = subflow.emplace([&](){
        // record the threads
        {
          std::scoped_lock lock(mutex);
          set.insert(executor.this_worker_id());
        }

        // all threads should be notified
        barrier.fetch_add(1, std::memory_order_relaxed);
        while(barrier.load(std::memory_order_relaxed) < W) {
          std::this_thread::yield();
        }
        
        // increment the counter
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      task.succeed(curr)
          .precede(merge);
    }

    merge.precede(cond);
  });

  //taskflow.dump(std::cout);
  executor.run_n(taskflow, 5).wait();
}